

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfHeader.c
# Opt level: O1

_Bool getIV(arguments *args)

{
  int_fast32_t fd;
  uint64_t *puVar1;
  
  fd = openForRead(args->target_file);
  if ((0 < fd) &&
     (puVar1 = (uint64_t *)readBytes((ulong)(args->state_size >> 3),fd), puVar1 != (uint64_t *)0x0))
  {
    args->iv = puVar1;
    return true;
  }
  return false;
}

Assistant:

bool getIV(arguments* args)
{
    int64_t read = openForRead(args->target_file);

    if(read > 0)
    {
       uint64_t* iv = (uint64_t*)readBytes((uint64_t)(args->state_size/8), read);
       if(iv != NULL)
       { 
           args->iv = iv;
           return true; 
       }
    }

    return false;
}